

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O1

void loadlc(int offset,int pos)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  char cVar7;
  
  lVar5 = (ulong)(pos != 0) * 9;
  uVar2 = (int)lVar5 + 7;
  if (pos == 0) {
    if (bank < 0xf0) {
      lVar6 = 2;
      uVar3 = bank;
      do {
        cVar1 = (char)(uVar3 & 0xf);
        cVar7 = cVar1 + '0';
        if (9 < (uVar3 & 0xf)) {
          cVar7 = cVar1 + '7';
        }
        prlnbuf[lVar6 + lVar5 + 6] = cVar7;
        uVar3 = (int)uVar3 >> 4;
        lVar6 = lVar6 + -1;
      } while (lVar6 != 0);
    }
    else {
      (prlnbuf + lVar5 + 7)[0] = '-';
      (prlnbuf + lVar5 + 7)[1] = '-';
      uVar2 = (int)lVar5 + 9;
    }
    uVar4 = (ulong)uVar2;
    uVar2 = uVar2 + 1;
    prlnbuf[uVar4] = ':';
    offset = offset + page * 0x2000;
  }
  lVar5 = 4;
  do {
    cVar1 = (char)(offset & 0xfU);
    cVar7 = cVar1 + '0';
    if (9 < (offset & 0xfU)) {
      cVar7 = cVar1 + '7';
    }
    (&DAT_00329ebf)[lVar5 + (ulong)uVar2] = cVar7;
    offset = offset >> 4;
    lVar5 = lVar5 + -1;
  } while (lVar5 != 0);
  return;
}

Assistant:

void
loadlc(int offset, int pos)
{
	int	i;

	if (pos)
		i = 16;
	else
		i = 7;

	if (pos == 0) {
		if (bank >= RESERVED_BANK) {
			prlnbuf[i++] = '-';
			prlnbuf[i++] = '-';
		}
		else {
			hexcon(2, bank, &prlnbuf[i]);
		}
		prlnbuf[i++] = ':';
		offset += page << 13;
	}
	hexcon(4, offset, &prlnbuf[i]);
}